

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

APInt __thiscall llvm::APInt::ushl_ov(APInt *this,APInt *ShAmt,bool *Overflow)

{
  bool bVar1;
  uint uVar2;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  APInt AVar4;
  undefined8 uVar3;
  
  bVar1 = uge((APInt *)Overflow,(ulong)ShAmt->BitWidth);
  *(bool *)in_RCX = bVar1;
  if (bVar1) {
    APInt(this,ShAmt->BitWidth,0,false);
    uVar3 = extraout_RDX;
  }
  else {
    uVar2 = countLeadingZeros(ShAmt);
    bVar1 = ugt((APInt *)Overflow,(ulong)uVar2);
    *(bool *)in_RCX = bVar1;
    AVar4 = shl(this,ShAmt);
    uVar3 = AVar4._8_8_;
  }
  AVar4._8_8_ = uVar3;
  AVar4.U.pVal = (uint64_t *)this;
  return AVar4;
}

Assistant:

APInt APInt::ushl_ov(const APInt &ShAmt, bool &Overflow) const {
  Overflow = ShAmt.uge(getBitWidth());
  if (Overflow)
    return APInt(BitWidth, 0);

  Overflow = ShAmt.ugt(countLeadingZeros());

  return *this << ShAmt;
}